

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O0

ostream * absl::lts_20250127::operator<<(ostream *out,Cord *cord)

{
  CordRepBtree **this;
  bool bVar1;
  const_pointer pvVar2;
  undefined1 local_168 [8];
  string_view chunk;
  ChunkIterator __end2;
  ChunkIterator __begin2;
  ChunkRange *__range2;
  Cord *cord_local;
  ostream *out_local;
  
  __begin2.btree_reader_.navigator_.node_[0xb] = (CordRepBtree *)Cord::Chunks(cord);
  this = __begin2.btree_reader_.navigator_.node_ + 0xb;
  Cord::ChunkRange::begin
            ((ChunkIterator *)(__end2.btree_reader_.navigator_.node_ + 0xb),(ChunkRange *)this);
  Cord::ChunkRange::end((ChunkIterator *)&chunk._M_str,(ChunkRange *)this);
  while( true ) {
    bVar1 = Cord::ChunkIterator::operator!=
                      ((ChunkIterator *)(__end2.btree_reader_.navigator_.node_ + 0xb),
                       (ChunkIterator *)&chunk._M_str);
    if (!bVar1) break;
    _local_168 = Cord::ChunkIterator::operator*
                           ((ChunkIterator *)(__end2.btree_reader_.navigator_.node_ + 0xb));
    pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)local_168);
    std::basic_string_view<char,_std::char_traits<char>_>::size
              ((basic_string_view<char,_std::char_traits<char>_> *)local_168);
    std::ostream::write((char *)out,(long)pvVar2);
    Cord::ChunkIterator::operator++((ChunkIterator *)(__end2.btree_reader_.navigator_.node_ + 0xb));
  }
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const Cord& cord) {
  for (absl::string_view chunk : cord.Chunks()) {
    out.write(chunk.data(), static_cast<std::streamsize>(chunk.size()));
  }
  return out;
}